

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O0

uint8_t * __thiscall ProtocolARP::Protocol2Hardware(ProtocolARP *this,uint8_t *protocolAddress)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *local_28;
  uint8_t *rc;
  uint8_t *puStack_18;
  int index;
  uint8_t *protocolAddress_local;
  ProtocolARP *this_local;
  
  local_28 = (uint8_t *)0x0;
  bVar1 = IsBroadcast(this,protocolAddress);
  if (bVar1) {
    iVar2 = (*this->MAC->_vptr_InterfaceMAC[6])();
    local_28 = (uint8_t *)CONCAT44(extraout_var,iVar2);
  }
  else {
    bVar1 = IsLocal(this,protocolAddress);
    puStack_18 = protocolAddress;
    if (!bVar1) {
      puStack_18 = ProtocolIPv4::GetGatewayAddress(this->IP);
    }
    iVar2 = LocateProtocolAddress(this,puStack_18);
    if (iVar2 == -1) {
      SendRequest(this,puStack_18);
    }
    else {
      local_28 = this->Cache[iVar2].MACAddress;
    }
  }
  return local_28;
}

Assistant:

const uint8_t* ProtocolARP::Protocol2Hardware(const uint8_t* protocolAddress)
{
    int index;
    const uint8_t* rc = nullptr;

    if (IsBroadcast(protocolAddress))
    {
        rc = MAC.GetBroadcastAddress();
    }
    else
    {
        if (!IsLocal(protocolAddress))
        {
            protocolAddress = IP.GetGatewayAddress();
        }
        index = LocateProtocolAddress(protocolAddress);

        if (index != -1)
        {
            rc = Cache[index].MACAddress;
        }
        else
        {
            SendRequest(protocolAddress);
        }
    }
    return rc;
}